

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::Split
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  size_type sVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  value_type local_c0;
  value_type local_a0;
  undefined4 local_80;
  value_type local_70;
  ulong local_50;
  size_type rpos;
  size_type lpos;
  string data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  string *str_local;
  
  data.field_2._8_8_ = lines;
  std::__cxx11::string::string((string *)&lpos,(string *)str);
  rpos = 0;
  do {
    sVar1 = rpos;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= sVar1) {
      str_local._7_1_ = true;
LAB_008ab771:
      local_80 = 1;
      std::__cxx11::string::~string((string *)&lpos);
      return str_local._7_1_;
    }
    local_50 = std::__cxx11::string::find_first_of((char *)&lpos,0xa6bed9);
    uVar2 = data.field_2._8_8_;
    if (local_50 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&lpos);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)uVar2,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      str_local._7_1_ = false;
      goto LAB_008ab771;
    }
    if (rpos < local_50) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&lpos);
      uVar2 = data.field_2._8_8_;
      if (*pcVar4 != '\r') goto LAB_008ab6f0;
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)&lpos);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)uVar2,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
LAB_008ab6f0:
      uVar2 = data.field_2._8_8_;
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)&lpos);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)uVar2,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    rpos = local_50 + 1;
  } while( true );
}

Assistant:

bool SystemTools::Split(const std::string& str,
                        std::vector<std::string>& lines)
{
  std::string data(str);
  std::string::size_type lpos = 0;
  while (lpos < data.length()) {
    std::string::size_type rpos = data.find_first_of("\n", lpos);
    if (rpos == std::string::npos) {
      // Line ends at end of string without a newline.
      lines.push_back(data.substr(lpos));
      return false;
    }
    if ((rpos > lpos) && (data[rpos - 1] == '\r')) {
      // Line ends in a "\r\n" pair, remove both characters.
      lines.push_back(data.substr(lpos, (rpos - 1) - lpos));
    } else {
      // Line ends in a "\n", remove the character.
      lines.push_back(data.substr(lpos, rpos - lpos));
    }
    lpos = rpos + 1;
  }
  return true;
}